

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_management.c
# Opt level: O0

void amqp_management_set_trace(AMQP_MANAGEMENT_HANDLE amqp_management,_Bool trace_on)

{
  LOGGER_LOG p_Var1;
  LOGGER_LOG l;
  _Bool trace_on_local;
  AMQP_MANAGEMENT_HANDLE amqp_management_local;
  
  if (amqp_management == (AMQP_MANAGEMENT_HANDLE)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqp_management.c"
                ,"amqp_management_set_trace",0x530,1,"NULL amqp_management");
    }
  }
  else {
    messagesender_set_trace(amqp_management->message_sender,trace_on);
    messagereceiver_set_trace(amqp_management->message_receiver,trace_on);
  }
  return;
}

Assistant:

void amqp_management_set_trace(AMQP_MANAGEMENT_HANDLE amqp_management, bool trace_on)
{
    if (amqp_management == NULL)
    {
        /* Codes_SRS_AMQP_MANAGEMENT_01_163: [ If `amqp_management` is NULL, `amqp_management_set_trace` shal do nothing. ]*/
        LogError("NULL amqp_management");
    }
    else
    {
        /* Codes_SRS_AMQP_MANAGEMENT_01_161: [ `amqp_management_set_trace` shall call `messagesender_set_trace` to enable/disable tracing on the message sender. ]*/
        messagesender_set_trace(amqp_management->message_sender, trace_on);
        /* Codes_SRS_AMQP_MANAGEMENT_01_162: [ `amqp_management_set_trace` shall call `messagereceiver_set_trace` to enable/disable tracing on the message receiver. ]*/
        messagereceiver_set_trace(amqp_management->message_receiver, trace_on);
    }
}